

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

void changemode(UINT8 noEcho)

{
  bool bVar1;
  undefined1 local_48 [8];
  termios newterm;
  UINT8 noEcho_local;
  
  newterm.c_ispeed._3_1_ = noEcho;
  if (termmode == 0xff) {
    tcgetattr(0,(termios *)&oldterm);
    termmode = '\0';
  }
  if (termmode != newterm.c_ispeed._3_1_) {
    bVar1 = newterm.c_ispeed._3_1_ == '\0';
    if (bVar1) {
      tcsetattr(0,0,(termios *)&oldterm);
    }
    else {
      memcpy(local_48,&oldterm,0x3c);
      newterm.c_oflag = newterm.c_oflag & 0xfffffff5;
      tcsetattr(0,0,(termios *)local_48);
    }
    termmode = !bVar1;
  }
  return;
}

Assistant:

static void changemode(UINT8 noEcho)
{
	if (termmode == 0xFF)
	{
		tcgetattr(STDIN_FILENO, &oldterm);
		termmode = 0;
	}
	if (termmode == noEcho)
		return;
	
	if (noEcho)
	{
		struct termios newterm;
		newterm = oldterm;
		newterm.c_lflag &= ~(ICANON | ECHO);
		tcsetattr(STDIN_FILENO, TCSANOW, &newterm);
		termmode = 1;
	}
	else
	{
		tcsetattr(STDIN_FILENO, TCSANOW, &oldterm);
		termmode = 0;
	}
	
	return;
}